

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkMiterAnd(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fOr,int fCompl2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *local_448;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pRoot2;
  Abc_Obj_t *pRoot1;
  Abc_Obj_t *pOutput2;
  Abc_Obj_t *pOutput1;
  Abc_Ntk_t *pNtkMiter;
  char Buffer [1000];
  int fCompl2_local;
  int fOr_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk1);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x18a,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkIsStrash(pNtk2);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x18b,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkCoNum(pNtk1);
  if (iVar1 != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x18c,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkCoNum(pNtk2);
  if (iVar1 != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x18d,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk1);
  if (iVar1 != 0) {
    __assert_fail("0 == Abc_NtkLatchNum(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x18e,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk2);
  if (iVar1 != 0) {
    __assert_fail("0 == Abc_NtkLatchNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,399,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkCiNum(pNtk1);
  iVar2 = Abc_NtkCiNum(pNtk2);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,400,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk1);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x191,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk2);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x192,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  pNtk1_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf((char *)&pNtkMiter,"product");
  pcVar4 = Extra_UtilStrsav((char *)&pNtkMiter);
  pNtk1_local->pName = pcVar4;
  Abc_NtkMiterPrepare(pNtk1,pNtk2,pNtk1_local,1,-1,0);
  Abc_NtkMiterAddOne(pNtk1,pNtk1_local);
  Abc_NtkMiterAddOne(pNtk2,pNtk1_local);
  pAVar5 = Abc_NtkPo(pNtk1,0);
  pObj = Abc_NtkPo(pNtk2,0);
  pAVar6 = Abc_ObjFanin0(pAVar5);
  pAVar6 = (pAVar6->field_6).pCopy;
  iVar1 = Abc_ObjFaninC0(pAVar5);
  pAVar5 = Abc_ObjNotCond(pAVar6,iVar1);
  pAVar6 = Abc_ObjFanin0(pObj);
  pAVar6 = (pAVar6->field_6).pCopy;
  uVar3 = Abc_ObjFaninC0(pObj);
  pAVar6 = Abc_ObjNotCond(pAVar6,uVar3 ^ fCompl2);
  if (fOr == 0) {
    local_448 = Abc_AigAnd((Abc_Aig_t *)pNtk1_local->pManFunc,pAVar5,pAVar6);
  }
  else {
    local_448 = Abc_AigOr((Abc_Aig_t *)pNtk1_local->pManFunc,pAVar5,pAVar6);
  }
  pAVar6 = Abc_NtkPo(pNtk1_local,0);
  Abc_ObjAddFanin(pAVar6,local_448);
  iVar1 = Abc_NtkCheck(pNtk1_local);
  if (iVar1 == 0) {
    printf("Abc_NtkMiterAnd: The network check has failed.\n");
    Abc_NtkDelete(pNtk1_local);
    pNtk1_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk1_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterAnd( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fOr, int fCompl2 )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pOutput1, * pOutput2;
    Abc_Obj_t * pRoot1, * pRoot2, * pMiter;

    assert( Abc_NtkIsStrash(pNtk1) );
    assert( Abc_NtkIsStrash(pNtk2) );
    assert( 1 == Abc_NtkCoNum(pNtk1) );
    assert( 1 == Abc_NtkCoNum(pNtk2) );
    assert( 0 == Abc_NtkLatchNum(pNtk1) );
    assert( 0 == Abc_NtkLatchNum(pNtk2) );
    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk1) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk2) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
//    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    sprintf( Buffer, "product" );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // perform strashing
    Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, 1, -1, 0 );
    Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
    Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
//    Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, 1 );
    pRoot1 = Abc_NtkPo(pNtk1,0);
    pRoot2 = Abc_NtkPo(pNtk2,0);
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot1)->pCopy, Abc_ObjFaninC0(pRoot1) );
    pOutput2 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot2)->pCopy, (int)Abc_ObjFaninC0(pRoot2) ^ fCompl2 );
    
    // create the miter of the two outputs
    if ( fOr )
        pMiter = Abc_AigOr( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    else
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiterAnd: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}